

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qstandardpaths_unix.cpp
# Opt level: O0

QStringList * dirsList(QString *xdgEnvVar)

{
  bool bVar1;
  iterator *this;
  QStringView *in_RDI;
  long in_FS_OFFSET;
  TokenizerResult<const_QString_&,_char16_t> *__range1;
  QStringList *dirs;
  QStringView dir;
  sentinel __end1;
  iterator __begin1;
  rvalue_ref in_stack_fffffffffffffee8;
  QStringTokenizerBase<QStringView,_QChar> *in_stack_fffffffffffffef0;
  QStringView *this_00;
  undefined6 in_stack_ffffffffffffff08;
  QChar in_stack_ffffffffffffff0e;
  QChar local_8a;
  QStringTokenizerBase<QStringView,_QChar> *local_88;
  storage_type_conflict *psStack_80;
  undefined1 local_69;
  undefined1 local_68 [62];
  undefined2 local_2a;
  QStringTokenizerBase<QStringView,_QChar> local_28;
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  ((DataPointer *)&in_RDI->m_size)->d = (Data *)&DAT_aaaaaaaaaaaaaaaa;
  in_RDI->m_data = (storage_type_conflict *)&DAT_aaaaaaaaaaaaaaaa;
  in_RDI[1].m_size = (qsizetype)&DAT_aaaaaaaaaaaaaaaa;
  this_00 = in_RDI;
  QList<QString>::QList((QList<QString> *)0x7ded89);
  local_2a = 0x3a;
  qTokenize<QString_const&,char16_t>((QString *)this_00,(char16_t *)in_RDI);
  memset(local_68,0xaa,0x38);
  QStringTokenizerBase<QStringView,_QChar>::begin(in_stack_fffffffffffffef0);
  local_69 = 0xaa;
  QStringTokenizerBase<QStringView,_QChar>::end(&local_28);
  while (bVar1 = operator!=(local_68), bVar1) {
    local_88 = (QStringTokenizerBase<QStringView,_QChar> *)&DAT_aaaaaaaaaaaaaaaa;
    psStack_80 = (storage_type_conflict *)&DAT_aaaaaaaaaaaaaaaa;
    this = (iterator *)
           QStringTokenizerBase<QStringView,_QChar>::iterator::operator*((iterator *)0x7dee3b);
    local_88 = this->tokenizer;
    psStack_80 = (storage_type_conflict *)(this->current).value.m_size;
    QChar::QChar<char16_t,_true>(&local_8a,L'/');
    bVar1 = QStringView::startsWith(this_00,in_stack_ffffffffffffff0e);
    if (bVar1) {
      QStringView::toString((QStringView *)this);
      QDir::cleanPath((QString *)CONCAT26(in_stack_ffffffffffffff0e.ucs,in_stack_ffffffffffffff08));
      QList<QString>::push_back((QList<QString> *)this,in_stack_fffffffffffffee8);
      QString::~QString((QString *)0x7deece);
      QString::~QString((QString *)0x7deed8);
    }
    QStringTokenizerBase<QStringView,_QChar>::iterator::operator++(this);
  }
  QListSpecialMethods<QString>::removeDuplicates((QListSpecialMethods<QString> *)0x7def4d);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_8) {
    return (QStringList *)this_00;
  }
  __stack_chk_fail();
}

Assistant:

static QStringList dirsList(const QString &xdgEnvVar)
{
    QStringList dirs;
    // http://standards.freedesktop.org/basedir-spec/latest/
    // Normalize paths, skip relative paths (the spec says relative paths
    // should be ignored)
    for (const auto dir : qTokenize(xdgEnvVar, u':'))
        if (dir.startsWith(u'/'))
            dirs.push_back(QDir::cleanPath(dir.toString()));

    // Remove duplicates from the list, there's no use for duplicated paths
    // in XDG_* env vars - if whatever is being looked for is not found in
    // the given directory the first time, it won't be there the second time.
    // Plus duplicate paths causes problems for example for mimetypes,
    // where duplicate paths here lead to duplicated mime types returned
    // for a file, eg "text/plain,text/plain" instead of "text/plain"
    dirs.removeDuplicates();

    return dirs;
}